

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

AliasRet aa_xref(jit_State *J,IRIns *refa,IRIns *xa,IRIns *xb)

{
  byte bVar1;
  byte bVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  long lVar5;
  long lVar6;
  IRIns *pIVar7;
  IRIns *pIVar8;
  IRIns *ir;
  
  pIVar3 = (J->cur).ir;
  ir = pIVar3 + (xb->field_0).op1;
  if ((ir == refa) && ((((xb->field_1).t.irt ^ (xa->field_1).t.irt) & 0x1f) == 0)) {
    AVar4 = ALIAS_MUST;
  }
  else {
    if (((refa->field_1).o == ')') && (lVar5 = (long)(short)(refa->field_0).op2, -1 < lVar5)) {
      refa = pIVar3 + (refa->field_0).op1;
      if (*(char *)((long)pIVar3 + lVar5 * 8 + 5) == '\x1d') {
        lVar5 = *(long *)&pIVar3[lVar5 + 1].i;
      }
      else {
        lVar5 = (long)pIVar3[lVar5].i;
      }
    }
    else {
      lVar5 = 0;
    }
    if (((ir->field_1).o == ')') && (lVar6 = (long)(short)(ir->field_0).op2, -1 < lVar6)) {
      ir = pIVar3 + (ir->field_0).op1;
      if (*(char *)((long)pIVar3 + lVar6 * 8 + 5) == '\x1d') {
        lVar6 = *(long *)&pIVar3[lVar6 + 1].i;
      }
      else {
        lVar6 = (long)pIVar3[lVar6].i;
      }
    }
    else {
      lVar6 = 0;
    }
    if (((refa->field_1).o == '\x19') && ((ir->field_1).o == '\x19')) {
      lVar6 = (lVar6 + (long)ir[1]) - (long)refa[1];
      ir = refa;
    }
    bVar1 = (byte)(xa->field_0).ot;
    if (refa == ir) {
      bVar2 = (byte)(xb->field_0).ot;
      if (lVar5 == lVar6) {
        if (("\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"[bVar1] ==
             "\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"[bVar2]) &&
           ((byte)((bVar2 & 0x1f) - 0xf) < 0xfe != (byte)((bVar1 & 0x1f) - 0xd) < 2)) {
          return ALIAS_MUST;
        }
      }
      else {
        if ((long)((ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                          [bVar1] + lVar5) <= lVar6) {
          return ALIAS_NO;
        }
        if ((long)(lVar6 + (ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                                  [bVar2]) <= lVar5) {
          return ALIAS_NO;
        }
      }
      AVar4 = ALIAS_MAY;
    }
    else {
      bVar2 = (byte)(xb->field_0).ot;
      if ((((bVar2 ^ bVar1) & 0x1f) == 0) ||
         ((AVar4 = ALIAS_NO, (bVar1 & 0x1f) - 0xf < 8 && ((bVar2 - 0xf ^ bVar1 - 0xf) == 1)))) {
        pIVar7 = aa_findcnew(J,refa);
        pIVar8 = aa_findcnew(J,ir);
        AVar4 = ALIAS_MAY;
        if (pIVar7 != pIVar8) {
          if ((pIVar7 == (IRIns *)0x0) || (pIVar8 == (IRIns *)0x0)) {
            if (pIVar8 != (IRIns *)0x0) {
              pIVar7 = pIVar8;
              ir = refa;
            }
            pIVar8 = pIVar7 + 1;
            if (pIVar8 < ir) {
              do {
                if (((uint)(pIVar8->field_0).op2 ==
                     (uint)((ulong)((long)pIVar7 - (long)pIVar3) >> 3)) &&
                   ((byte)((pIVar8->field_1).o + 0xb6) < 4)) {
                  return ALIAS_MAY;
                }
                pIVar8 = pIVar8 + 1;
              } while (pIVar8 < ir);
            }
          }
          AVar4 = ALIAS_NO;
        }
      }
    }
  }
  return AVar4;
}

Assistant:

static AliasRet aa_xref(jit_State *J, IRIns *refa, IRIns *xa, IRIns *xb)
{
  ptrdiff_t ofsa = 0, ofsb = 0;
  IRIns *refb = IR(xb->op1);
  IRIns *basea = refa, *baseb = refb;
  if (refa == refb && irt_sametype(xa->t, xb->t))
    return ALIAS_MUST;  /* Shortcut for same refs with identical type. */
  /* Offset-based disambiguation. */
  if (refa->o == IR_ADD && irref_isk(refa->op2)) {
    IRIns *irk = IR(refa->op2);
    basea = IR(refa->op1);
    ofsa = (LJ_64 && irk->o == IR_KINT64) ? (ptrdiff_t)ir_k64(irk)->u64 :
					    (ptrdiff_t)irk->i;
  }
  if (refb->o == IR_ADD && irref_isk(refb->op2)) {
    IRIns *irk = IR(refb->op2);
    baseb = IR(refb->op1);
    ofsb = (LJ_64 && irk->o == IR_KINT64) ? (ptrdiff_t)ir_k64(irk)->u64 :
					    (ptrdiff_t)irk->i;
  }
  /* Treat constified pointers like base vs. base+offset. */
  if (basea->o == IR_KPTR && baseb->o == IR_KPTR) {
    ofsb += (char *)ir_kptr(baseb) - (char *)ir_kptr(basea);
    baseb = basea;
  }
  /* This implements (very) strict aliasing rules.
  ** Different types do NOT alias, except for differences in signedness.
  ** Type punning through unions is allowed (but forces a reload).
  */
  if (basea == baseb) {
    ptrdiff_t sza = irt_size(xa->t), szb = irt_size(xb->t);
    if (ofsa == ofsb) {
      if (sza == szb && irt_isfp(xa->t) == irt_isfp(xb->t))
	return ALIAS_MUST;  /* Same-sized, same-kind. May need to convert. */
    } else if (ofsa + sza <= ofsb || ofsb + szb <= ofsa) {
      return ALIAS_NO;  /* Non-overlapping base+-o1 vs. base+-o2. */
    }
    /* NYI: extract, extend or reinterpret bits (int <-> fp). */
    return ALIAS_MAY;  /* Overlapping or type punning: force reload. */
  }
  if (!irt_sametype(xa->t, xb->t) &&
      !(irt_typerange(xa->t, IRT_I8, IRT_U64) &&
	((xa->t.irt - IRT_I8) ^ (xb->t.irt - IRT_I8)) == 1))
    return ALIAS_NO;
  /* NYI: structural disambiguation. */
  return aa_cnew(J, basea, baseb);  /* Try to disambiguate allocations. */
}